

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::Resize
          (Array<Qentem::Value<char16_t>_> *this,SizeT new_size)

{
  SizeT SVar1;
  Value<char16_t> *pVVar2;
  Value<char16_t> *end;
  SizeT new_size_local;
  Array<Qentem::Value<char16_t>_> *this_local;
  
  if (new_size == 0) {
    Reset(this);
  }
  else {
    SVar1 = Size(this);
    if (new_size < SVar1) {
      pVVar2 = Storage(this);
      end = End(this);
      Memory::Dispose<Qentem::Value<char16_t>>(pVVar2 + new_size,end);
      setSize(this,new_size);
    }
    resize(this,new_size);
  }
  return;
}

Assistant:

void Resize(SizeT new_size) {
        if (new_size != 0) {
            if (Size() > new_size) {
                // Shrink
                Memory::Dispose((Storage() + new_size), End());
                setSize(new_size);
            }

            resize(new_size);
            return;
        }

        Reset();
    }